

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O2

uint tonk::inplace_itoa_vitaut_1_cat(char *buf,uint32_t val)

{
  uint uVar1;
  char *pcVar2;
  
  if (val == 0) {
    *buf = '0';
    uVar1 = 1;
  }
  else {
    uVar1 = (LZCOUNT(val) ^ 0x1fU) * 0x4d1 + 0x4d1 >> 0xc;
    uVar1 = (uVar1 - (val < *(uint *)(PowersOf10 + (ulong)uVar1 * 4))) + 1;
    pcVar2 = buf + ((ulong)uVar1 - 1);
    for (; 99 < val; val = val / 100) {
      *(undefined2 *)(pcVar2 + -1) = *(undefined2 *)(str100p + (ulong)(val % 100) * 2);
      pcVar2 = pcVar2 + -2;
    }
    if (val < 10) {
      *pcVar2 = str100p[(ulong)val * 2 + 1];
    }
    else {
      *(undefined2 *)(pcVar2 + -1) = *(undefined2 *)(str100p + (ulong)val * 2);
    }
  }
  return uVar1;
}

Assistant:

unsigned inplace_itoa_vitaut_1_cat(char* buf, uint32_t val)
{
    // Common case of zero
    if (val == 0) {
        buf[0] = '0';
        return 1;
    }

    const unsigned bits = NonzeroLowestBitIndex(val);
    const unsigned t = (bits + 1) * 1233 >> 12;
    const unsigned digits = t + 1 - (val < PowersOf10[t]);

    buf += digits;

    while (val >= 100)
    {
        uint32_t const old = val;

        buf -= 2;
        val /= 100;
#ifdef _MSC_VER
        *(uint16_t*)buf = str100p[old - (val * 100)];
#else
        memcpy(buf, &str100p[old - (val * 100)], sizeof(uint16_t));
#endif
    }

    if (val >= 10)
    {
        buf -= 2;
#ifdef _MSC_VER
        *(uint16_t*)buf = str100p[val];
#else
        memcpy(buf, &str100p[val], sizeof(uint16_t));
#endif
    }
    else
    {
        buf[-1] = (char)(uint8_t)(str100p[val] >> 8);
    }

    return digits;
}